

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

void __thiscall Pager::_open(Pager *this,string *filename)

{
  int iVar1;
  char *__file;
  __off_t _Var2;
  string *filename_local;
  Pager *this_local;
  
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0x42,0x180);
  this->fileDescriptor = iVar1;
  if (this->fileDescriptor == -1) {
    std::operator<<((ostream *)&std::cout,"Unable to open file\n");
  }
  _Var2 = lseek(this->fileDescriptor,0,2);
  this->fileLength = (uint32_t)_Var2;
  this->numOfPages = this->fileLength >> 0xc;
  if ((this->fileLength & 0xfff) != 0) {
    std::operator<<((ostream *)&std::cout,"DB file is corrupt!\n");
  }
  return;
}

Assistant:

void Pager::_open(std::string filename) {
	fileDescriptor = open(filename.c_str(), O_RDWR | O_CREAT, S_IRUSR | S_IWUSR);
	if (fileDescriptor == -1) {
		std::cout << "Unable to open file\n";
	}

	fileLength = lseek(fileDescriptor, 0, SEEK_END);
	numOfPages = fileLength / PAGE_SIZE;

	if (fileLength % PAGE_SIZE != 0) {
		std::cout << "DB file is corrupt!\n";
	}
}